

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O0

int dwarfstring_add_to(dwarfstring_s *g,size_t newlen)

{
  size_t __n;
  char *__dest;
  unsigned_long local_38;
  size_t malloclen;
  size_t lastpos;
  char *b;
  size_t newlen_local;
  dwarfstring_s *g_local;
  
  __n = g->s_size - g->s_avail;
  local_38 = newlen + 1;
  if (local_38 < minimumnewlen) {
    local_38 = minimumnewlen;
  }
  __dest = (char *)malloc(local_38);
  if (__dest == (char *)0x0) {
    g_local._4_4_ = 0;
  }
  else {
    if (__n != 0) {
      memcpy(__dest,g->s_data,__n);
    }
    if (g->s_malloc != '\0') {
      free(g->s_data);
      g->s_data = (char *)0x0;
    }
    g->s_data = __dest;
    g->s_data[__n] = '\0';
    g->s_size = newlen;
    g->s_avail = newlen - __n;
    g->s_malloc = '\x01';
    g_local._4_4_ = 1;
  }
  return g_local._4_4_;
}

Assistant:

static int
dwarfstring_add_to(struct dwarfstring_s *g,size_t newlen)
{
    char *b          = 0;
    /*  s_size - s_avail is the string without counting
        the null following the string. So, is  strlen()  */
    size_t lastpos   = g->s_size - g->s_avail;
    size_t malloclen = newlen+1;

    /*  ASSERT: newlen as well as malloclen  are
        greater than g->s_size at both call points */
    if (malloclen < minimumnewlen) {
        malloclen = minimumnewlen;
    }
    /*  Not zeroing the new buffer block. */
    b = malloc(malloclen);
    if (!b) {
        return FALSE;
    }
    if (lastpos > 0) {
        /* Copying the non-null bytes in s_data. */
        memcpy(b,g->s_data,lastpos);
    }
    if (g->s_malloc) {
        free(g->s_data);
        g->s_data = 0;
    }
    g->s_data = b;
    /*  s_data[lastpos] is one past the end of anything
        counted as string
        in s_data at the point of call, and is guaranteed
        to be safe as we increased the size of s_data, we did not
        shrink.  And, too, we add 1 to newlen, always,
        so space for a terminating null byte is guaranteed
        available. */
    g->s_data[lastpos] = 0;
    g->s_size = newlen;
    g->s_avail = newlen - lastpos;
    g->s_malloc = TRUE;
    return TRUE;
}